

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

UnaryAssertionOperator slang::ast::getUnaryOp(TokenKind kind)

{
  UnaryAssertionOperator UVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,kind);
  if (iVar2 == 0x5f) {
    UVar1 = Always;
  }
  else if (iVar2 == 0xa3) {
    UVar1 = Eventually;
  }
  else if (iVar2 == 0x10e) {
    UVar1 = SNextTime;
  }
  else {
    if (iVar2 == 0xe2) {
      return Not;
    }
    if (iVar2 == 0x10c) {
      UVar1 = SAlways;
    }
    else if (iVar2 == 0x10d) {
      UVar1 = SEventually;
    }
    else {
      UVar1 = NextTime;
    }
  }
  return UVar1;
}

Assistant:

static UnaryAssertionOperator getUnaryOp(TokenKind kind) {
    // clang-format off
    switch (kind) {
        case TokenKind::NotKeyword: return UnaryAssertionOperator::Not;
        case TokenKind::NextTimeKeyword: return UnaryAssertionOperator::NextTime;
        case TokenKind::SNextTimeKeyword: return UnaryAssertionOperator::SNextTime;
        case TokenKind::AlwaysKeyword: return UnaryAssertionOperator::Always;
        case TokenKind::SAlwaysKeyword: return UnaryAssertionOperator::SAlways;
        case TokenKind::EventuallyKeyword: return UnaryAssertionOperator::Eventually;
        case TokenKind::SEventuallyKeyword: return UnaryAssertionOperator::SEventually;
        default: SLANG_UNREACHABLE;
    }
    // clang-format on
}